

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void CalcResizePosSizeFromAnyCorner
               (ImGuiWindow *window,ImVec2 *corner_target,ImVec2 *corner_norm,ImVec2 *out_pos,
               ImVec2 *out_size)

{
  ImVec2 IVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar9 [16];
  undefined1 extraout_var [56];
  
  auVar2 = vinsertps_avx(in_ZMM0._0_16_,in_ZMM1._0_16_,0x10);
  IVar1 = window->Pos;
  auVar7._8_8_ = 0;
  auVar7._0_4_ = IVar1.x;
  auVar7._4_4_ = IVar1.y;
  auVar5 = vsubps_avx(auVar7,auVar2);
  fVar3 = (*corner_target).x;
  fVar4 = (*corner_target).y;
  auVar9._0_4_ = auVar5._0_4_ * fVar3 + auVar2._0_4_;
  auVar9._4_4_ = auVar5._4_4_ * fVar4 + auVar2._4_4_;
  auVar9._8_4_ = auVar5._8_4_ * 0.0 + auVar2._8_4_;
  auVar9._12_4_ = auVar5._12_4_ * 0.0 + auVar2._12_4_;
  auVar8._0_4_ = IVar1.x + (window->Size).x;
  auVar8._4_4_ = IVar1.y + (window->Size).y;
  auVar8._8_8_ = 0;
  auVar2 = vsubps_avx(auVar2,auVar8);
  auVar5._0_4_ = auVar2._0_4_ * fVar3 + auVar8._0_4_;
  auVar5._4_4_ = auVar2._4_4_ * fVar4 + auVar8._4_4_;
  auVar5._8_4_ = auVar2._8_4_ * 0.0 + 0.0;
  auVar5._12_4_ = auVar2._12_4_ * 0.0 + 0.0;
  auVar2 = vsubps_avx(auVar5,auVar9);
  auVar6._0_8_ = CalcWindowSizeAfterConstraint(window,auVar2._0_8_);
  auVar6._8_56_ = extraout_var;
  IVar1 = (ImVec2)vmovlps_avx(auVar9);
  *corner_norm = IVar1;
  if ((corner_target->x == 0.0) && (!NAN(corner_target->x))) {
    corner_norm->x = auVar9._0_4_ - (auVar6._0_4_ - auVar2._0_4_);
  }
  if ((corner_target->y == 0.0) && (!NAN(corner_target->y))) {
    auVar2 = vsubps_avx(auVar6._0_16_,auVar2);
    auVar2 = vsubps_avx(auVar9,auVar2);
    fVar3 = (float)vextractps_avx(auVar2,1);
    corner_norm->y = fVar3;
  }
  IVar1 = (ImVec2)vmovlpd_avx(auVar6._0_16_);
  *out_pos = IVar1;
  return;
}

Assistant:

static void CalcResizePosSizeFromAnyCorner(ImGuiWindow* window, const ImVec2& corner_target, const ImVec2& corner_norm, ImVec2* out_pos, ImVec2* out_size)
{
    ImVec2 pos_min = ImLerp(corner_target, window->Pos, corner_norm);                // Expected window upper-left
    ImVec2 pos_max = ImLerp(window->Pos + window->Size, corner_target, corner_norm); // Expected window lower-right
    ImVec2 size_expected = pos_max - pos_min;
    ImVec2 size_constrained = CalcWindowSizeAfterConstraint(window, size_expected);
    *out_pos = pos_min;
    if (corner_norm.x == 0.0f)
        out_pos->x -= (size_constrained.x - size_expected.x);
    if (corner_norm.y == 0.0f)
        out_pos->y -= (size_constrained.y - size_expected.y);
    *out_size = size_constrained;
}